

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_sinks.h
# Opt level: O2

filename_t *
spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  filename_t ext;
  filename_t basename;
  type w;
  size_t local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_288;
  BasicMemoryWriter<char,_std::allocator<char>_> local_248;
  
  local_248.super_BasicWriter<char>.buffer_ = &local_248.buffer_.super_Buffer<char>;
  local_248.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_00124e70;
  local_248.buffer_.super_Buffer<char>.ptr_ = local_248.buffer_.data_;
  local_248.buffer_.super_Buffer<char>.size_ = 0;
  local_248.buffer_.super_Buffer<char>.capacity_ = 500;
  local_248.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_00124eb8;
  local_2e0 = index;
  if (index == 0) {
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              (&local_248.super_BasicWriter<char>,(BasicCStringRef<char>)0x1183ce,filename);
  }
  else {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_2d8._M_string_length = 0;
    local_2d8.field_2._M_local_buf[0] = '\0';
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_288,filename);
    local_298 = &local_2d8;
    local_290 = &local_2b8;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_298,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_288);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl(&local_288);
    fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long,std::__cxx11::string>
              (&local_248.super_BasicWriter<char>,(BasicCStringRef<char>)0x11848b,&local_2b8,
               &local_2e0,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&local_248.super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_248);
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::MemoryWriter, fmt::WMemoryWriter>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            w.write(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            w.write(SPDLOG_FILENAME_T("{}"), filename);
        }
        return w.str();
    }